

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O3

LY_ERR json_print_value(jsonpr_ctx *pctx,ly_ctx *ctx,lyd_value *val,lys_module *param_4)

{
  undefined8 in_RAX;
  char *text;
  char *pcVar1;
  ly_bool dynamic;
  ly_bool local_21;
  
  local_21 = (ly_bool)((ulong)in_RAX >> 0x38);
  text = (char *)(*val->realtype->plugin->print)
                           (ctx,val,LY_VALUE_JSON,param_4,&local_21,(size_t *)0x0);
  if (text == (char *)0x0) {
    return LY_EINVAL;
  }
  do {
    switch(val->realtype->basetype) {
    case LY_TYPE_BINARY:
    case LY_TYPE_UINT64:
    case LY_TYPE_STRING:
    case LY_TYPE_BITS:
    case LY_TYPE_DEC64:
    case LY_TYPE_ENUM:
    case LY_TYPE_IDENT:
    case LY_TYPE_INST:
    case LY_TYPE_INT64:
      json_print_string(pctx->out,text);
LAB_0013e457:
      if (local_21 == '\0') {
        return LY_SUCCESS;
      }
      free(text);
      return LY_SUCCESS;
    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_BOOL:
    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
      pcVar1 = text;
      if (*text == '\0') {
        pcVar1 = "null";
      }
      ly_print_(pctx->out,"%s",pcVar1);
      goto LAB_0013e457;
    case LY_TYPE_EMPTY:
      ly_print_(pctx->out,"[null]");
      goto LAB_0013e457;
    default:
      ly_log(pctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
             ,0x18e);
      return LY_EINT;
    case LY_TYPE_UNION:
      val = (lyd_value *)(val->field_2).target;
    }
  } while( true );
}

Assistant:

static LY_ERR
json_print_value(struct jsonpr_ctx *pctx, const struct ly_ctx *ctx, const struct lyd_value *val,
        const struct lys_module *local_mod)
{
    ly_bool dynamic;
    LY_DATA_TYPE basetype;
    const char *value;

    value = val->realtype->plugin->print(ctx, val, LY_VALUE_JSON, (void *)local_mod, &dynamic, NULL);
    LY_CHECK_RET(!value, LY_EINVAL);
    basetype = val->realtype->basetype;

print_val:
    /* leafref is not supported */
    switch (basetype) {
    case LY_TYPE_UNION:
        /* use the resolved type */
        val = &val->subvalue->value;
        basetype = val->realtype->basetype;
        goto print_val;

    case LY_TYPE_BINARY:
    case LY_TYPE_STRING:
    case LY_TYPE_BITS:
    case LY_TYPE_ENUM:
    case LY_TYPE_INST:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT64:
    case LY_TYPE_DEC64:
    case LY_TYPE_IDENT:
        json_print_string(pctx->out, value);
        break;

    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_BOOL:
        ly_print_(pctx->out, "%s", value[0] ? value : "null");
        break;

    case LY_TYPE_EMPTY:
        ly_print_(pctx->out, "[null]");
        break;

    default:
        /* error */
        LOGINT_RET(pctx->ctx);
    }

    if (dynamic) {
        free((char *)value);
    }

    return LY_SUCCESS;
}